

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall DReachabilityPropagator::propagate(DReachabilityPropagator *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  
  update_innodes(this);
  for (p_Var2 = (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->new_edge)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])(this);
    if ((char)iVar1 == '\0') {
      return false;
    }
    Tint::operator=(this->last_state_e + (int)p_Var2[1]._M_color,0);
  }
  for (p_Var2 = (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->rem_node)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                      (this,(ulong)p_Var2[1]._M_color);
    if ((char)iVar1 == '\0') {
      return false;
    }
    Tint::operator=(this->last_state_n + (int)p_Var2[1]._M_color,1);
  }
  for (p_Var2 = (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->new_node)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])(this);
    if ((char)iVar1 == '\0') {
      return false;
    }
    Tint::operator=(this->last_state_n + (int)p_Var2[1]._M_color,0);
  }
  for (p_Var2 = (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->rem_edge)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x12])
                      (this,(ulong)p_Var2[1]._M_color);
    if ((char)iVar1 == '\0') {
      return false;
    }
    Tint::operator=(this->last_state_e + (int)p_Var2[1]._M_color,1);
  }
  if (((this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
       (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (iVar1 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x10])(this,1),
     (char)iVar1 == '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::propagate() {
	update_innodes();  // In case I have not awaken
										 // through DReachabilityPropagator::wakeup method
	if (DEBUG) {
		std::cout << "PROPAGATE" << '\n';
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!propagateNewEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_IN;
	}

	for (it = rem_node.begin(); it != rem_node.end(); ++it) {
		if (!propagateRemNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_OUT;
	}

	// In this class, nothing happens here, but this way inheriting classes
	// can be executed here
	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!propagateNewNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_IN;
	}

	for (it = rem_edge.begin(); it != rem_edge.end(); ++it) {
		if (!propagateRemEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_OUT;
	}

	if (!new_node.empty() || !rem_edge.empty()) {
		if (DEBUG) {
			std::cout << "Checking new nodes and removed edges" << '\n';
		}
		if (!_propagateReachability()) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
	}

	if (DEBUG) {
		std::cout << "True" << __FILE__ << __LINE__ << '\n';
	}

	return true;
}